

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Vector3 * __thiscall iDynTree::KinDynComputations::getCenterOfMassBiasAcc(KinDynComputations *this)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  LinearVector3T *this_00;
  KinDynComputations *in_RSI;
  Vector3 *in_RDI;
  double total_mass;
  Vector3 comVel;
  Wrench totalMomentumBiasInCOMInertial;
  Position com_in_inertial;
  Wrench totalMomentumBiasInInertialInertial;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffdf8;
  KinDynComputationsPrivateAttributes *in_stack_fffffffffffffe00;
  KinDynComputations *in_stack_fffffffffffffe10;
  Vector3 *this_01;
  double *in_stack_fffffffffffffe40;
  MatrixBase<Eigen::Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe48;
  Position local_160 [24];
  Rotation local_148 [56];
  KinDynComputations *in_stack_fffffffffffffef0;
  Wrench local_100;
  Transform local_a0 [8];
  SpatialVector<iDynTree::SpatialForceVector> local_98;
  KinDynComputations *in_stack_ffffffffffffffb0;
  Wrench local_40;
  
  this_01 = in_RDI;
  computeRawMassMatrixAndTotalMomentum(in_stack_fffffffffffffe10);
  computeBiasAccFwdKinematics(in_stack_fffffffffffffef0);
  Wrench::Wrench((Wrench *)in_stack_fffffffffffffe00);
  pKVar1 = in_RSI->pimpl;
  iDynTree::ComputeLinearAndAngularMomentumDerivativeBias
            (&pKVar1->m_robot_model,&pKVar1->m_linkPos,&pKVar1->m_linkVel,&pKVar1->m_linkBiasAcc,
             &local_40);
  getCenterOfMassPosition(in_RSI);
  iDynTree::Rotation::Identity();
  iDynTree::Position::operator-(local_160);
  iDynTree::Transform::Transform((Transform *)&local_100,local_148,local_160);
  iDynTree::Transform::operator*(local_a0,&local_100);
  getCenterOfMassVelocity(in_stack_ffffffffffffffb0);
  KinDynComputationsPrivateAttributes::getRobotLockedInertia(in_stack_fffffffffffffe00);
  iDynTree::SpatialInertia::getMass();
  VectorFixSize<3U>::VectorFixSize(this_01);
  this_00 = SpatialVector<iDynTree::SpatialForceVector>::getLinearVec3(&local_98);
  toEigen<3U>(this_01);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>>::operator/
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  toEigen<3U>(this_01);
  Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)this_00,
             in_stack_fffffffffffffdf8);
  Wrench::~Wrench((Wrench *)0x1cdd99);
  Wrench::~Wrench((Wrench *)0x1cdda6);
  return in_RDI;
}

Assistant:

Vector3 KinDynComputations::getCenterOfMassBiasAcc()
{
    this->computeRawMassMatrixAndTotalMomentum();
    this->computeBiasAccFwdKinematics();

    // We compute the bias of the center of mass from the bias of the total momentum derivative
    Wrench totalMomentumBiasInInertialInertial;
    ComputeLinearAndAngularMomentumDerivativeBias(pimpl->m_robot_model,
                                                  pimpl->m_linkPos,
                                                  pimpl->m_linkVel,
                                                  pimpl->m_linkBiasAcc,
                                                  totalMomentumBiasInInertialInertial);

    // The total momentum is written in the (inertial,inertial) frame
    // To get the com velocity, acceleration, we need to write it in the (com,inertial) frame
    // For the velocity we need just to multiply it for the adjoint, for the acceleration
    // we need also to account for the derivative of the adjoint term
    Position com_in_inertial = this->getCenterOfMassPosition();
    Wrench totalMomentumBiasInCOMInertial = Transform(Rotation::Identity(),-com_in_inertial)*totalMomentumBiasInInertialInertial;

    // TODO : cache com velocity
    Vector3 comVel = KinDynComputations::getCenterOfMassVelocity();

    // We account for the derivative of the transform (we can avoid this computation because we are intersted only in the linear part
    // of the momentum derivative
    // toEigen(totalMomentumBiasInCOMInertial.getAngularVec3()) =
    //    toEigen(pimpl->m_totalMomentum.getLinearVec3()).cross(toEigen(comVel));

    double total_mass = pimpl->getRobotLockedInertia().getMass();

    // Mass is constant, so we can easily divide disregarding the derivative
    Vector3 comBiasAcc;

    toEigen(comBiasAcc) = toEigen(totalMomentumBiasInCOMInertial.getLinearVec3())/total_mass;

    return comBiasAcc;
}